

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void vec_add_internal(void *v,void *elem)

{
  uint uVar1;
  void *__dest;
  byte bVar2;
  ulong uVar3;
  
  uVar1 = *v;
  uVar3 = (ulong)uVar1;
  if (uVar3 == 0) {
    __dest = (void *)((long)v + 0x10);
    *(void **)((long)v + 8) = __dest;
    uVar3 = 0;
  }
  else {
    __dest = *(void **)((long)v + 8);
    if (__dest == (void *)((long)v + 0x10)) {
      __dest = malloc(0x40);
      *(void **)((long)v + 8) = __dest;
      memcpy(__dest,(void *)((long)v + 0x10),uVar3 << 3);
    }
    else if ((uVar1 & 7) == 0) {
      bVar2 = 4;
      for (uVar1 = (int)uVar1 >> 3; (uVar1 & 1) == 0; uVar1 = (int)uVar1 >> 1) {
        bVar2 = bVar2 + 1;
      }
      if (uVar1 < 2) {
        __dest = realloc(__dest,(long)(1 << (bVar2 & 0x1f)) << 3);
        *(void **)((long)v + 8) = __dest;
        uVar3 = (ulong)*v;
      }
    }
  }
  *(void **)((long)__dest + uVar3 * 8) = elem;
  *(int *)v = (int)uVar3 + 1;
  return;
}

Assistant:

void vec_add_internal(void *v, void *elem) {
  AbstractVec *av = (AbstractVec *)v;
  if (!av->n) {
    av->v = av->e;
  } else if (av->v == av->e) {
    av->v = (void **)MALLOC(INITIAL_VEC_SIZE * sizeof(void *));
    memcpy(av->v, av->e, av->n * sizeof(void *));
  } else {
    if ((av->n & (INITIAL_VEC_SIZE - 1)) == 0) {
      int l = av->n, nl = (1 + INITIAL_VEC_SHIFT);
      l = l >> INITIAL_VEC_SHIFT;
      while (!(l & 1)) {
        l = l >> 1;
        nl++;
      }
      l = l >> 1;
      if (!av->n || !l) {
        nl = 1 << nl;
        av->v = (void **)REALLOC(av->v, nl * sizeof(void *));
      }
    }
  }
  av->v[av->n] = elem;
  av->n++;
}